

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O0

void aom_fft_2d_gen(float *input,float *temp,float *output,int n,aom_fft_1d_func_t tform,
                   aom_fft_transpose_func_t transpose,aom_fft_unpack_func_t unpack,int vec_size)

{
  int in_ECX;
  float *in_RDX;
  float *in_RSI;
  long in_RDI;
  code *in_R8;
  code *in_R9;
  int x_1;
  int x;
  int local_38;
  int local_34;
  
  for (local_34 = 0; local_34 < in_ECX; local_34 = (int)tform + local_34) {
    (*in_R8)(in_RDI + (long)local_34 * 4,in_RDX + local_34,in_ECX);
  }
  (*in_R9)(in_RDX,in_RSI,in_ECX);
  for (local_38 = 0; local_38 < in_ECX; local_38 = (int)tform + local_38) {
    (*in_R8)(in_RSI + local_38,in_RDX + local_38,in_ECX);
  }
  (*in_R9)(in_RDX,in_RSI,in_ECX);
  (*transpose)(in_RSI,in_RDX,in_ECX);
  return;
}

Assistant:

void aom_fft_2d_gen(const float *input, float *temp, float *output, int n,
                    aom_fft_1d_func_t tform, aom_fft_transpose_func_t transpose,
                    aom_fft_unpack_func_t unpack, int vec_size) {
  for (int x = 0; x < n; x += vec_size) {
    tform(input + x, output + x, n);
  }
  transpose(output, temp, n);

  for (int x = 0; x < n; x += vec_size) {
    tform(temp + x, output + x, n);
  }
  transpose(output, temp, n);

  unpack(temp, output, n);
}